

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jishmof.c
# Opt level: O2

void SaveFrame(AVFrame *pFrame,int width,int height,int iFrame)

{
  FILE *__stream;
  int iVar1;
  char szFilename [32];
  
  iVar1 = 0;
  sprintf(szFilename,"./output/frames/frame%d.ppm",(ulong)(uint)iFrame);
  __stream = fopen(szFilename,"wb");
  if (__stream == (FILE *)0x0) {
    return;
  }
  fprintf(__stream,"P6\n%d %d\n255\n",(ulong)(uint)width,(ulong)(uint)height);
  if (height < 1) {
    height = 0;
  }
  for (; height != iVar1; iVar1 = iVar1 + 1) {
    fwrite(pFrame->data[0] + (long)iVar1 * (long)pFrame->linesize[0],1,(long)(width * 3),__stream);
  }
  fclose(__stream);
  return;
}

Assistant:

void SaveFrame(AVFrame *pFrame, int width, int height, int iFrame) {
  FILE *pFile;
  char szFilename[32];
  int  y;

  // Open file
  sprintf(szFilename, "./output/frames/frame%d.ppm", iFrame);
  pFile=fopen(szFilename, "wb");
  if(pFile==NULL)
    return;

  // Write header
  fprintf(pFile, "P6\n%d %d\n255\n", width, height);

  // Write pixel data
  for(y=0; y<height; y++)
    fwrite(pFrame->data[0]+y*pFrame->linesize[0], 1, width*3, pFile);

  // Close file
  fclose(pFile);
}